

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O2

string * cmCatViews(string *__return_storage_ptr__,
                   initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                   views)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t __n;
  long lVar2;
  ulong uVar3;
  iterator ppVar4;
  unsigned_long __n2;
  ulong uVar5;
  iterator ppVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  pointer pcVar10;
  ptrdiff_t _Num;
  size_t __n_00;
  
  ppVar6 = views._M_array;
  uVar9 = 0;
  __n_00 = 0;
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uVar5 = 0;
  ppVar4 = ppVar6;
  for (lVar2 = views._M_len * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    pbVar1 = ppVar4->second;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        uVar3 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar1->_M_dataplus)._M_p != &pbVar1->field_2) {
          uVar3 = (pbVar1->field_2)._M_allocated_capacity;
        }
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p != &pbVar8->field_2) {
          uVar7 = (pbVar8->field_2)._M_allocated_capacity;
        }
        if (uVar3 <= uVar7) goto LAB_00124297;
      }
      __n_00 = pbVar1->_M_string_length;
      pbVar8 = pbVar1;
      uVar9 = uVar5;
    }
LAB_00124297:
    uVar5 = uVar5 + (ppVar4->first)._M_len;
    ppVar4 = ppVar4 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(pbVar8->_M_dataplus)._M_p == &pbVar8->field_2) {
      uVar3 = 0xf;
    }
    else {
      uVar3 = (pbVar8->field_2)._M_allocated_capacity;
    }
    if (uVar5 <= uVar3) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)pbVar8);
      goto LAB_001242e3;
    }
  }
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_001242e3:
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  if ((__n_00 != 0 && uVar9 != 0) &&
      pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
    memmove(pcVar10 + uVar9,pcVar10,__n_00);
  }
  pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (lVar2 = 0; views._M_len * 0x18 - lVar2 != 0; lVar2 = lVar2 + 0x18) {
    if ((pbVar8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
       (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((long)&ppVar6->second + lVar2) != pbVar8)) {
      __n = *(size_t *)((long)&(ppVar6->first)._M_len + lVar2);
      if (__n != 0) {
        memmove(pcVar10,*(void **)((long)&(ppVar6->first)._M_str + lVar2),__n);
        pcVar10 = pcVar10 + __n;
      }
    }
    else {
      pcVar10 = pcVar10 + __n_00;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCatViews(
  std::initializer_list<std::pair<cm::string_view, std::string*>> views)
{
  std::size_t totalSize = 0;
  std::string* rvalueString = nullptr;
  std::size_t rvalueStringLength = 0;
  std::size_t rvalueStringOffset = 0;
  for (auto const& view : views) {
    // Find the rvalue string with the largest capacity.
    if (view.second &&
        (!rvalueString ||
         view.second->capacity() > rvalueString->capacity())) {
      rvalueString = view.second;
      rvalueStringLength = rvalueString->length();
      rvalueStringOffset = totalSize;
    }
    totalSize += view.first.size();
  }

  std::string result;
  std::string::size_type initialLen = 0;
  if (rvalueString && rvalueString->capacity() >= totalSize) {
    result = std::move(*rvalueString);
  } else {
    rvalueString = nullptr;
  }
  result.resize(totalSize);
  if (rvalueString && rvalueStringOffset > 0) {
    std::copy_backward(result.begin(), result.begin() + rvalueStringLength,
                       result.begin() + rvalueStringOffset +
                         rvalueStringLength);
  }
  std::string::iterator sit = result.begin() + initialLen;
  for (auto const& view : views) {
    if (rvalueString && view.second == rvalueString) {
      sit += rvalueStringLength;
    } else {
      sit = std::copy_n(view.first.data(), view.first.size(), sit);
    }
  }
  return result;
}